

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSizeAllocationsManager.hpp
# Opt level: O0

void __thiscall
Diligent::VariableSizeAllocationsManager::AddNewBlock
          (VariableSizeAllocationsManager *this,OffsetType Offset,OffsetType Size)

{
  Char *Message;
  iterator iVar1;
  pointer ppVar2;
  char (*in_RCX) [18];
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_bool>
  pVar3;
  iterator OrderIt;
  undefined1 local_60 [8];
  string msg;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
  local_30;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_bool>
  NewBlockIt;
  OffsetType Size_local;
  OffsetType Offset_local;
  VariableSizeAllocationsManager *this_local;
  
  NewBlockIt._8_8_ = Size;
  Size_local = Offset;
  Offset_local = (OffsetType)this;
  pVar3 = std::
          map<unsigned_long,Diligent::VariableSizeAllocationsManager::FreeBlockInfo,std::less<unsigned_long>,Diligent::STDAllocator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,Diligent::IMemoryAllocator>>
          ::emplace<unsigned_long&,unsigned_long&>
                    ((map<unsigned_long,Diligent::VariableSizeAllocationsManager::FreeBlockInfo,std::less<unsigned_long>,Diligent::STDAllocator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,Diligent::IMemoryAllocator>>
                      *)this,&Size_local,(unsigned_long *)&NewBlockIt.second);
  msg.field_2._8_8_ = pVar3.first._M_node;
  NewBlockIt.first._M_node._0_1_ = pVar3.second;
  local_30._M_node = (_Base_ptr)msg.field_2._8_8_;
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    FormatString<char[26],char[18]>
              ((string *)local_60,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"NewBlockIt.second",in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"AddNewBlock",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
               ,0x1b3);
    std::__cxx11::string::~string((string *)local_60);
  }
  iVar1 = std::
          multimap<unsigned_long,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>,std::less<unsigned_long>,Diligent::STDAllocator<std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>,Diligent::IMemoryAllocator>>
          ::
          emplace<unsigned_long&,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>&>
                    ((multimap<unsigned_long,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>,std::less<unsigned_long>,Diligent::STDAllocator<std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>,Diligent::IMemoryAllocator>>
                      *)&this->m_FreeBlocksBySize,(unsigned_long *)&NewBlockIt.second,&local_30);
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
           ::operator->(&local_30);
  (ppVar2->second).OrderBySizeIt._M_node = iVar1._M_node;
  return;
}

Assistant:

void AddNewBlock(OffsetType Offset, OffsetType Size)
    {
        auto NewBlockIt = m_FreeBlocksByOffset.emplace(Offset, Size);
        VERIFY_EXPR(NewBlockIt.second);
        auto OrderIt                           = m_FreeBlocksBySize.emplace(Size, NewBlockIt.first);
        NewBlockIt.first->second.OrderBySizeIt = OrderIt;
    }